

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall minibag::View::~View(View *this)

{
  bool bVar1;
  reference ppMVar2;
  reference ppBVar3;
  vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_> *in_RDI;
  BagQuery *query;
  iterator __end1_1;
  iterator __begin1_1;
  vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_> *__range1_1;
  MessageRange *range;
  iterator __end1;
  iterator __begin1;
  vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_> *__range1;
  vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_> *in_stack_ffffffffffffff98;
  BagQuery *in_stack_ffffffffffffffa0;
  __normal_iterator<minibag::BagQuery_**,_std::vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>_>
  local_38;
  vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_> *local_30;
  MessageRange *local_28;
  MessageRange **local_20;
  __normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (MessageRange **)
       std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>::begin
                 ((vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_> *)
                  in_stack_ffffffffffffff98);
  local_20 = (MessageRange **)
             std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>::end
                       ((vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_> *
                        )in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    ppMVar2 = __gnu_cxx::
              __normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
              ::operator*(local_18);
    local_28 = *ppMVar2;
    if (local_28 != (MessageRange *)0x0) {
      operator_delete(local_28,0x20);
    }
    __gnu_cxx::
    __normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
    ::operator++(local_18);
  }
  local_30 = in_RDI + 1;
  local_38._M_current =
       (BagQuery **)
       std::vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>::begin
                 (in_stack_ffffffffffffff98);
  std::vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>::end
            (in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<minibag::BagQuery_**,_std::vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<minibag::BagQuery_**,_std::vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    ppBVar3 = __gnu_cxx::
              __normal_iterator<minibag::BagQuery_**,_std::vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>_>
              ::operator*(&local_38);
    in_stack_ffffffffffffffa0 = *ppBVar3;
    if (in_stack_ffffffffffffffa0 != (BagQuery *)0x0) {
      BagQuery::~BagQuery((BagQuery *)0x17b357);
      operator_delete(in_stack_ffffffffffffffa0,0x40);
    }
    __gnu_cxx::
    __normal_iterator<minibag::BagQuery_**,_std::vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>_>
    ::operator++(&local_38);
  }
  std::vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>::~vector(in_RDI);
  std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>::~vector
            ((vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_> *)in_RDI);
  return;
}

Assistant:

View::~View() {
    for (MessageRange* range : ranges_)
        delete range;
    for (BagQuery* query : queries_)
        delete query;
}